

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

void PickBestCandidate(WebPAnimEncoder *enc,Candidate *candidates,int is_key_frame,
                      EncodedFrame *encoded_frame)

{
  WebPData *in_RCX;
  long lVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  WebPMuxAnimDispose prev_dispose_method;
  WebPMuxFrameInfo *dst;
  size_t candidate_size;
  size_t best_size;
  int best_idx;
  int i;
  WebPData *local_50;
  WebPAnimEncoder *in_stack_ffffffffffffffc8;
  WebPAnimEncoder *enc_00;
  int local_28;
  int local_24;
  
  local_28 = -1;
  enc_00 = (WebPAnimEncoder *)0xffffffffffffffff;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if ((*(int *)(in_RSI + (long)local_24 * 0x68 + 0x60) != 0) &&
       (in_stack_ffffffffffffffc8 = *(WebPAnimEncoder **)(in_RSI + (long)local_24 * 0x68 + 8),
       in_stack_ffffffffffffffc8 < enc_00)) {
      local_28 = local_24;
      enc_00 = in_stack_ffffffffffffffc8;
    }
  }
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if (*(int *)(in_RSI + (long)local_24 * 0x68 + 0x60) != 0) {
      if (local_24 == local_28) {
        local_50 = in_RCX;
        if (in_EDX != 0) {
          local_50 = in_RCX + 3;
        }
        memcpy(local_50,(void *)(in_RSI + (long)local_24 * 0x68 + 0x20),0x30);
        GetEncodedData((WebPMemoryWriter *)(in_RSI + (long)local_24 * 0x68),local_50);
        if (in_EDX == 0) {
          SetPreviousDisposeMethod
                    (enc_00,(WebPMuxAnimDispose)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        }
        lVar1 = in_RSI + (long)local_24 * 0x68;
        *(undefined8 *)(in_RDI + 0x34) = *(undefined8 *)(lVar1 + 0x50);
        *(undefined8 *)(in_RDI + 0x3c) = *(undefined8 *)(lVar1 + 0x58);
      }
      else {
        WebPMemoryWriterClear((WebPMemoryWriter *)0x1a2e2e);
        *(undefined4 *)(in_RSI + (long)local_24 * 0x68 + 0x60) = 0;
      }
    }
  }
  return;
}

Assistant:

static void PickBestCandidate(WebPAnimEncoder* const enc,
                              Candidate* const candidates, int is_key_frame,
                              EncodedFrame* const encoded_frame) {
  int i;
  int best_idx = -1;
  size_t best_size = ~0;
  for (i = 0; i < CANDIDATE_COUNT; ++i) {
    if (candidates[i].evaluate_) {
      const size_t candidate_size = candidates[i].mem_.size;
      if (candidate_size < best_size) {
        best_idx = i;
        best_size = candidate_size;
      }
    }
  }
  assert(best_idx != -1);
  for (i = 0; i < CANDIDATE_COUNT; ++i) {
    if (candidates[i].evaluate_) {
      if (i == best_idx) {
        WebPMuxFrameInfo* const dst = is_key_frame
                                      ? &encoded_frame->key_frame_
                                      : &encoded_frame->sub_frame_;
        *dst = candidates[i].info_;
        GetEncodedData(&candidates[i].mem_, &dst->bitstream);
        if (!is_key_frame) {
          // Note: Previous dispose method only matters for non-keyframes.
          // Also, we don't want to modify previous dispose method that was
          // selected when a non key-frame was assumed.
          const WebPMuxAnimDispose prev_dispose_method =
              (best_idx == LL_DISP_NONE || best_idx == LOSSY_DISP_NONE)
                  ? WEBP_MUX_DISPOSE_NONE
                  : WEBP_MUX_DISPOSE_BACKGROUND;
          SetPreviousDisposeMethod(enc, prev_dispose_method);
        }
        enc->prev_rect_ = candidates[i].rect_;  // save for next frame.
      } else {
        WebPMemoryWriterClear(&candidates[i].mem_);
        candidates[i].evaluate_ = 0;
      }
    }
  }
}